

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

Promise<kj::AuthenticatedStream> __thiscall
kj::anon_unknown_0::FdConnectionReceiver::acceptImpl(FdConnectionReceiver *this,bool authenticated)

{
  PromiseArena *pPVar1;
  UnixEventPort *eventPort;
  PromiseRejector *pPVar2;
  PromiseRejector *pPVar3;
  _func_int ***ppp_Var4;
  _func_int ***ppp_Var5;
  undefined4 fd;
  undefined8 uVar6;
  Fault FVar7;
  PromiseBase PVar8;
  undefined8 uVar9;
  PromiseNode *pPVar10;
  Disposer *pDVar11;
  char cVar12;
  int iVar13;
  uint uVar14;
  void *pvVar15;
  AsyncStreamFd *pAVar16;
  char in_DL;
  undefined7 in_register_00000031;
  _func_int **pp_Var17;
  int *unaff_R15;
  TransformPromiseNodeBase *this_00;
  Own<kj::PeerIdentity,_std::nullptr_t> OVar18;
  OwnFd ownFd;
  socklen_t addrlen;
  Fault f;
  int one;
  sockaddr_storage addr;
  undefined1 local_1a8 [16];
  Fault local_198;
  AsyncStreamFd *pAStack_190;
  PromiseNode *local_188;
  Disposer *pDStack_180;
  PromiseBase local_178;
  undefined1 local_170 [52];
  undefined4 local_13c;
  SocketAddress local_138;
  sockaddr local_b0 [8];
  
  pp_Var17 = (_func_int **)CONCAT71(in_register_00000031,authenticated);
  local_1a8._12_4_ = 0x80;
  iVar13 = accept4(*(int *)(pp_Var17 + 1),local_b0,(socklen_t *)(local_1a8 + 0xc),0x80800);
  if (iVar13 < 0) {
    local_178.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
    unaff_R15 = __errno_location();
    do {
      iVar13 = *unaff_R15;
      if (((0x2a < iVar13 - 0x47U) ||
          ((0x68160000001U >> ((ulong)(iVar13 - 0x47U) & 0x3f) & 1) == 0)) && (iVar13 != 4)) {
        if (iVar13 != 0xb) {
          local_198.exception = (Exception *)0x0;
          local_138.addrlen = 0;
          local_138.wildcard = false;
          local_138._5_3_ = 0;
          local_138.addr._0_8_ = 0;
          kj::_::Debug::Fault::init
                    (&local_198,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                    );
          kj::_::Debug::Fault::fatal(&local_198);
        }
        UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_1a8);
        uVar6 = local_1a8._0_8_;
        pPVar1 = (PromiseArena *)
                 ((SleepHooks *)&((PromiseArenaMember *)local_1a8._0_8_)->arena)->_vptr_SleepHooks;
        if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_1a8._0_8_ - (long)pPVar1) < 0x30) {
          pvVar15 = operator_new(0x400);
          this_00 = (TransformPromiseNodeBase *)((long)pvVar15 + 0x3d0);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (this_00,(OwnPromiseNode *)local_1a8,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1386:54)>
                     ::anon_class_16_2_d4b6dc1c_for_func::operator());
          *(undefined ***)((long)pvVar15 + 0x3d0) = &PTR_destroy_0064a308;
          *(_func_int ***)((long)pvVar15 + 0x3f0) = pp_Var17;
          *(char *)((long)pvVar15 + 0x3f8) = in_DL;
          *(void **)((long)pvVar15 + 0x3d8) = pvVar15;
        }
        else {
          ((SleepHooks *)&((PromiseArenaMember *)local_1a8._0_8_)->arena)->_vptr_SleepHooks =
               (_func_int **)0x0;
          this_00 = (TransformPromiseNodeBase *)(local_1a8._0_8_ + -0x30);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (this_00,(OwnPromiseNode *)local_1a8,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1386:54)>
                     ::anon_class_16_2_d4b6dc1c_for_func::operator());
          ((PromiseArenaMember *)(uVar6 + -0x30))->_vptr_PromiseArenaMember =
               (_func_int **)&PTR_destroy_0064a308;
          ((PromiseArenaMember *)(uVar6 + -0x10))->_vptr_PromiseArenaMember = pp_Var17;
          *(char *)&((PromiseArenaMember *)(uVar6 + -0x10))->arena = in_DL;
          ((PromiseArenaMember *)(uVar6 + -0x30))->arena = pPVar1;
        }
        PVar8.node.ptr = local_178.node.ptr;
        local_138._0_8_ = &DAT_004a8171;
        local_138.addr._0_8_ = &DAT_004a81d0;
        local_138.addr.inet4.sin_zero = (uchar  [8])&DAT_4c0000058b;
        local_170._0_8_ = this_00;
        kj::_::PromiseDisposer::
        appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                  ((PromiseDisposer *)&local_198,(OwnPromiseNode *)local_170,
                   (SourceLocation *)&local_138);
        uVar6 = local_170._0_8_;
        *(Exception **)PVar8.node.ptr = local_198.exception;
        if ((TransformPromiseNodeBase *)local_170._0_8_ != (TransformPromiseNodeBase *)0x0) {
          local_170._0_8_ = (TransformPromiseNodeBase *)0x0;
          kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar6);
        }
        uVar6 = local_1a8._0_8_;
        if ((UnixEventPort *)local_1a8._0_8_ == (UnixEventPort *)0x0) {
          return (Promise<kj::AuthenticatedStream>)(PromiseNode *)PVar8.node.ptr;
        }
        local_1a8._0_8_ = (UnixEventPort *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar6);
        return (Promise<kj::AuthenticatedStream>)(PromiseNode *)PVar8.node.ptr;
      }
      iVar13 = accept4(*(int *)(pp_Var17 + 1),local_b0,(socklen_t *)(local_1a8 + 0xc),0x80800);
      this = (FdConnectionReceiver *)local_178;
    } while (iVar13 < 0);
  }
  local_1a8._0_4_ = iVar13;
  cVar12 = (*(code *)**(undefined8 **)pp_Var17[4])(pp_Var17[4],local_b0,local_1a8._12_4_);
  if (cVar12 == '\0') {
    acceptImpl(this,authenticated);
  }
  else {
    local_13c = 1;
    do {
      iVar13 = ::setsockopt(local_1a8._0_4_,6,1,&local_13c,4);
      if (-1 < iVar13) {
        iVar13 = 0;
        break;
      }
      uVar14 = kj::_::Debug::getOsErrorNumber(false);
      unaff_R15 = (int *)((ulong)unaff_R15 & 0xffffffff);
      if (uVar14 != 0xffffffff) {
        unaff_R15 = (int *)(ulong)uVar14;
      }
      iVar13 = (int)unaff_R15;
    } while (uVar14 == 0xffffffff);
    if (((iVar13 != 0) && (iVar13 != 0x5c)) && (iVar13 != 0x5f)) {
      local_198.exception = (Exception *)0x0;
      local_138.addrlen = 0;
      local_138.wildcard = false;
      local_138._5_3_ = 0;
      local_138.addr._0_8_ = 0;
      kj::_::Debug::Fault::init
                (&local_198,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_198);
    }
    local_188 = (PromiseNode *)0x0;
    pDStack_180 = (Disposer *)0x0;
    local_198.exception = (Exception *)0x0;
    pAStack_190 = (AsyncStreamFd *)0x0;
    eventPort = (UnixEventPort *)pp_Var17[3];
    fd = local_1a8._0_4_;
    local_1a8._0_4_ = 0xffffffff;
    pAVar16 = (AsyncStreamFd *)operator_new(0xa8);
    AsyncStreamFd::AsyncStreamFd(pAVar16,eventPort,fd,7,3);
    FVar7.exception = local_198.exception;
    local_198.exception =
         (Exception *)&kj::_::HeapDisposer<kj::(anonymous_namespace)::AsyncStreamFd>::instance;
    if (pAStack_190 != (AsyncStreamFd *)0x0) {
      pPVar2 = (PromiseRejector *)&pAStack_190->super_AsyncCapabilityStream;
      pPVar3 = (PromiseRejector *)&pAStack_190->super_AsyncCapabilityStream;
      pAStack_190 = pAVar16;
      (**(_func_int **)((FVar7.exception)->ownFile).content.ptr)
                (FVar7.exception,
                 pPVar2->_vptr_PromiseRejector[-2] + (long)&pPVar3->_vptr_PromiseRejector);
      pAVar16 = pAStack_190;
    }
    pAStack_190 = pAVar16;
    pPVar10 = local_188;
    pDVar11 = pDStack_180;
    if (in_DL != '\0') {
      SocketAddress::SocketAddress(&local_138,local_b0,local_1a8._12_4_);
      OVar18 = SocketAddress::getIdentity
                         ((SocketAddress *)local_170,(LowLevelAsyncIoProvider *)&local_138,
                          (NetworkFilter *)pp_Var17[2],(AsyncIoStream *)pp_Var17[4]);
      pDVar11 = (Disposer *)local_170._8_8_;
      local_170._8_8_ = (Disposer *)0x0;
      pPVar10 = (PromiseNode *)local_170._0_8_;
      if (pDStack_180 != (Disposer *)0x0) {
        ppp_Var4 = &pDStack_180->_vptr_Disposer;
        ppp_Var5 = &pDStack_180->_vptr_Disposer;
        pDStack_180 = pDVar11;
        (**(local_188->super_PromiseArenaMember)._vptr_PromiseArenaMember)
                  (local_188,(*ppp_Var4)[-2] + (long)ppp_Var5,OVar18.ptr);
        local_188 = pPVar10;
        pPVar10 = local_188;
        pDVar11 = pDStack_180;
      }
    }
    pDStack_180 = pDVar11;
    local_188 = pPVar10;
    local_170._16_8_ = local_198.exception;
    local_170._24_8_ = pAStack_190;
    pAStack_190 = (AsyncStreamFd *)0x0;
    local_170._32_8_ = local_188;
    local_170._40_8_ = pDStack_180;
    pDStack_180 = (Disposer *)0x0;
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediatePromiseNode<kj::AuthenticatedStream>,kj::_::PromiseDisposer,kj::AuthenticatedStream>
              ((PromiseDisposer *)&local_138,(AuthenticatedStream *)(local_170 + 0x10));
    uVar9 = local_138._0_8_;
    uVar6 = local_170._40_8_;
    local_138.addrlen = 0;
    local_138.wildcard = false;
    local_138._5_3_ = 0;
    this->super_ConnectionReceiver = uVar9;
    if ((Disposer *)local_170._40_8_ != (Disposer *)0x0) {
      local_170._40_8_ = (Disposer *)0x0;
      (***(_func_int ***)local_170._32_8_)(local_170._32_8_,(*(_func_int ***)uVar6)[-2] + uVar6);
    }
    uVar6 = local_170._24_8_;
    if ((AsyncStreamFd *)local_170._24_8_ != (AsyncStreamFd *)0x0) {
      local_170._24_8_ = (AsyncStreamFd *)0x0;
      (***(_func_int ***)local_170._16_8_)
                (local_170._16_8_,uVar6 + *(long *)(*(long *)uVar6 + -0x10));
    }
    pDVar11 = pDStack_180;
    if (pDStack_180 != (Disposer *)0x0) {
      pDStack_180 = (Disposer *)0x0;
      (**(local_188->super_PromiseArenaMember)._vptr_PromiseArenaMember)
                (local_188,
                 ((PromiseRejector *)&pDVar11->_vptr_Disposer)->_vptr_PromiseRejector[-2] +
                 (long)&((PromiseRejector *)&pDVar11->_vptr_Disposer)->_vptr_PromiseRejector);
    }
    pAVar16 = pAStack_190;
    if (pAStack_190 != (AsyncStreamFd *)0x0) {
      pAStack_190 = (AsyncStreamFd *)0x0;
      (**(_func_int **)((local_198.exception)->ownFile).content.ptr)
                (local_198.exception,
                 ((PromiseRejector *)&pAVar16->super_AsyncCapabilityStream)->_vptr_PromiseRejector
                 [-2] + (long)&((PromiseRejector *)&pAVar16->super_AsyncCapabilityStream)->
                               _vptr_PromiseRejector);
    }
  }
  OwnFd::~OwnFd((OwnFd *)local_1a8);
  return (Promise<kj::AuthenticatedStream>)(PromiseNode *)this;
}

Assistant:

Promise<AuthenticatedStream> acceptImpl(bool authenticated) {
    int newFd;

    struct sockaddr_storage addr;
    socklen_t addrlen = sizeof(addr);

  retry:
#if __linux__ && !__BIONIC__
    newFd = ::accept4(fd, reinterpret_cast<struct sockaddr*>(&addr), &addrlen,
                      SOCK_NONBLOCK | SOCK_CLOEXEC);
#else
    newFd = ::accept(fd, reinterpret_cast<struct sockaddr*>(&addr), &addrlen);
#endif

    if (newFd >= 0) {
      kj::OwnFd ownFd(newFd);
      if (!filter.shouldAllow(reinterpret_cast<struct sockaddr*>(&addr), addrlen)) {
        // Ignore disallowed address.
        return acceptImpl(authenticated);
      } else {
        // TODO(perf):  As a hack for the 0.4 release we are always setting
        //   TCP_NODELAY because Nagle's algorithm pretty much kills Cap'n Proto's
        //   RPC protocol.  Later, we should extend the interface to provide more
        //   control over this.  Perhaps write() should have a flag which
        //   specifies whether to pass MSG_MORE.
        int one = 1;
        KJ_SYSCALL_HANDLE_ERRORS(::setsockopt(
              ownFd.get(), IPPROTO_TCP, TCP_NODELAY, (char*)&one, sizeof(one))) {
          case EOPNOTSUPP:
          case ENOPROTOOPT: // (returned for AF_UNIX in cygwin)
#if __FreeBSD__
          case EINVAL: // (returned for AF_UNIX in FreeBSD)
#endif
            break;
          default:
            KJ_FAIL_SYSCALL("setsocketopt(IPPROTO_TCP, TCP_NODELAY)", error);
        }

        AuthenticatedStream result;
        result.stream = heap<AsyncStreamFd>(eventPort, ownFd.release(), NEW_FD_FLAGS,
                                            UnixEventPort::FdObserver::OBSERVE_READ_WRITE);
        if (authenticated) {
          result.peerIdentity = SocketAddress(reinterpret_cast<struct sockaddr*>(&addr), addrlen)
              .getIdentity(lowLevel, filter, *result.stream);
        }
        return kj::mv(result);
      }
    } else {
      int error = errno;

      switch (error) {
        case EAGAIN:
#if EAGAIN != EWOULDBLOCK
        case EWOULDBLOCK:
#endif
          // Not ready yet.
          return observer.whenBecomesReadable().then([this,authenticated]() {
            return acceptImpl(authenticated);
          });

        case EINTR:
        case ENETDOWN:
#ifdef EPROTO
        // EPROTO is not defined on OpenBSD.
        case EPROTO:
#endif
        case EHOSTDOWN:
        case EHOSTUNREACH:
        case ENETUNREACH:
        case ECONNABORTED:
        case ETIMEDOUT:
          // According to the Linux man page, accept() may report an error if the accepted
          // connection is already broken.  In this case, we really ought to just ignore it and
          // keep waiting.  But it's hard to say exactly what errors are such network errors and
          // which ones are permanent errors.  We've made a guess here.
          goto retry;

        default:
          KJ_FAIL_SYSCALL("accept", error);
      }

    }
  }